

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void nuts_tran_listener_closed(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  char *pcVar5;
  nng_socket local_38;
  nng_listener local_34;
  nng_socket s;
  nng_listener l;
  
  local_38.id = 0;
  local_34.id = 0;
  pcVar4 = strchr(scheme,0x36);
  if (pcVar4 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x149,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_listener_closed::nuts_addr_);
  nVar2 = nng_pair1_open(&local_38);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x14b,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_listener_create(&local_34,local_38,nuts_tran_listener_closed::nuts_addr_);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x14c,"%s: expected success, got %s (%d)",
                           "nng_listener_create(&l, s, addr)",pcVar4,nVar2);
    if (iVar3 != 0) {
      iVar3 = nng_listener_id(local_34);
      acutest_check_((uint)(0 < iVar3),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                     ,0x14d,"%s","nng_listener_id(l) > 0");
      nVar2 = nng_listener_close(local_34);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x14e,"%s: expected success, got %s (%d)","nng_listener_close(l)",
                             pcVar4,nVar2);
      if (iVar3 != 0) {
        num = nng_listener_start(local_34,0);
        pcVar4 = nng_strerror(NNG_ENOENT);
        acutest_check_((uint)(num == NNG_ENOENT),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                       ,0x14f,"%s fails with %s","nng_listener_start(l, 0)",pcVar4,nVar2);
        pcVar4 = nng_strerror(NNG_ENOENT);
        pcVar5 = nng_strerror(num);
        acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listener_start(l, 0)",pcVar4,0xc,
                         pcVar5,(ulong)num);
        nVar2 = nng_socket_close(local_38);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x150,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                               pcVar4,nVar2);
        if (iVar3 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
nuts_tran_listener_closed(const char *scheme)
{
	nng_socket   s = NNG_SOCKET_INITIALIZER;
	nng_listener l = NNG_LISTENER_INITIALIZER;
	const char  *addr;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s);
	NUTS_PASS(nng_listener_create(&l, s, addr));
	NUTS_TRUE(nng_listener_id(l) > 0);
	NUTS_PASS(nng_listener_close(l));
	NUTS_FAIL(nng_listener_start(l, 0), NNG_ENOENT);
	NUTS_CLOSE(s);
}